

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O0

Vector<double,_2> __thiscall mathtool::Vector<double,_2>::normalize(Vector<double,_2> *this)

{
  ostream *poVar1;
  Vector<double,_2> *in_RSI;
  double dVar2;
  double in_XMM1_Qa;
  Vector<double,_2> VVar3;
  double local_68;
  int local_44;
  int i;
  double magnitude;
  double local_30;
  double local_28;
  double local_20 [2];
  Vector<double,_2> *this_local;
  Vector<double,_2> *newv;
  
  local_20[0] = 0.0;
  local_28 = 0.0;
  local_30 = 0.0;
  magnitude = 0.0;
  this_local = this;
  Vector(this,local_20,&local_28,&local_30,&magnitude);
  dVar2 = norm(in_RSI);
  local_44 = 0;
  local_68 = dVar2;
  do {
    if (1 < local_44) {
LAB_0011758b:
      for (; local_44 < 2; local_44 = local_44 + 1) {
        local_68 = in_RSI->v[local_44] / dVar2;
        this->v[local_44] = local_68;
      }
      VVar3.v[1] = in_XMM1_Qa;
      VVar3.v[0] = local_68;
      return (Vector<double,_2>)VVar3.v;
    }
    this->v[local_44] = in_RSI->v[local_44] / dVar2;
    if (0.0 < in_RSI->v[local_44] || in_RSI->v[local_44] == 0.0) {
      local_68 = in_RSI->v[local_44];
    }
    else {
      local_68 = -in_RSI->v[local_44];
    }
    in_XMM1_Qa = dVar2 * 10000000000.0;
    if (in_XMM1_Qa < local_68) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"! taking the norm of a zero");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,2);
      poVar1 = std::operator<<(poVar1," vector");
      local_68 = (double)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      goto LAB_0011758b;
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

Vector<T,D> Vector<T,D>::normalize() const     // normalize
    {
        Vector<T,D> newv;
        T magnitude = norm();
        int i;
        for(i=0; i<D; i++){
            newv.v[i] = v[i] / magnitude;
            if(ABS(v[i]) > magnitude * HUGENUMBER){
                cerr << "! taking the norm of a zero" << D << " vector" << endl;
                break;
            }
        }
        for(; i < D; i++){
            newv.v[i] = v[i] / magnitude;
        }
        return newv;
    }